

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O0

ON__LayerExtensions *
ON__LayerExtensions::LayerExtensions(ON_Layer *layer,uchar *layer_m_extension_bits,bool bCreate)

{
  ON_UserData *p;
  ON__LayerExtensions *this;
  ON_UUID local_38;
  ON__LayerExtensions *local_28;
  ON__LayerExtensions *ud;
  uchar *puStack_18;
  bool bCreate_local;
  uchar *layer_m_extension_bits_local;
  ON_Layer *layer_local;
  
  ud._7_1_ = bCreate;
  puStack_18 = layer_m_extension_bits;
  layer_m_extension_bits_local = (uchar *)layer;
  local_38 = ON_ClassId::Uuid(&m_ON__LayerExtensions_class_rtti);
  p = ON_Object::GetUserData((ON_Object *)layer,&local_38);
  local_28 = Cast(&p->super_ON_Object);
  if (local_28 == (ON__LayerExtensions *)0x0) {
    if ((ud._7_1_ & 1) == 0) {
      SetExtensionBit(puStack_18,'\x01');
    }
    else {
      this = (ON__LayerExtensions *)operator_new(0xe0);
      ON__LayerExtensions(this);
      local_28 = this;
      ON_Object::AttachUserData((ON_Object *)layer_m_extension_bits_local,(ON_UserData *)this);
      ClearExtensionBit(puStack_18,'\x01');
    }
  }
  else {
    ClearExtensionBit(puStack_18,'\x01');
  }
  return local_28;
}

Assistant:

ON__LayerExtensions* ON__LayerExtensions::LayerExtensions(const ON_Layer& layer, const unsigned char* layer_m_extension_bits, bool bCreate)
{
  ON__LayerExtensions* ud = ON__LayerExtensions::Cast(layer.GetUserData(ON_CLASS_ID(ON__LayerExtensions)));

  if ( 0 == ud )
  {
    if ( bCreate )
    {
      ud = new ON__LayerExtensions();
      const_cast<ON_Layer&>(layer).AttachUserData(ud);
      // Clear 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will check
      // for ON__LayerExtensions userdata.
      ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
    else
    {
      // Set 0x01 bit of ON_Layer::m_extension_bits so 
      // ON_Layer visibility and color queries will not
      // perform the expensive check for ON__LayerExtensions 
      // userdata. This speeds up visibility and color queries 
      // that occur millions of times when complicated models
      // are rendered.
      SetExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
    }
  }
  else
  {
    // Clear 0x01 bit of ON_Layer::m_extension_bits so 
    // ON_Layer visibility and color queries will check
    // for ON__LayerExtensions userdata.
    ClearExtensionBit( const_cast<unsigned char*>(layer_m_extension_bits), 0x01 );
  }

  return ud;
}